

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval_f.c
# Opt level: O0

int ffcvtn(int inputType,void *input,char *undef,long ntodo,int outputType,void *nulval,void *output
          ,int *anynull,int *status)

{
  float fVar1;
  long in_RCX;
  long in_RDX;
  double *in_RSI;
  int in_EDI;
  undefined4 in_R8D;
  float *in_R9;
  float *in_stack_00000008;
  undefined4 *in_stack_00000010;
  int *in_stack_00000018;
  long i;
  long local_38;
  
  switch(in_R8D) {
  case 0xb:
    if ((in_EDI == 0xb) || (in_EDI == 0xe)) {
      for (local_38 = 0; local_38 < in_RCX; local_38 = local_38 + 1) {
        *(undefined1 *)((long)in_stack_00000008 + local_38) =
             *(undefined1 *)((long)in_RSI + local_38);
      }
    }
    else if (in_EDI == 0x15) {
      fffi2i1((short *)in_RSI,in_RCX,1.0,0.0,0,0,'\0',(char *)0x0,(int *)0x0,
              (uchar *)in_stack_00000008,in_stack_00000018);
    }
    else {
      if (in_EDI == 0x29) {
        for (local_38 = 0; local_38 < in_RCX; local_38 = local_38 + 1) {
          if (*(char *)(in_RDX + local_38) == '\0') {
            if ((long)in_RSI[local_38] < 0) {
              *in_stack_00000018 = -0xb;
              *(undefined1 *)((long)in_stack_00000008 + local_38) = 0;
            }
            else if ((long)in_RSI[local_38] < 0x100) {
              *(char *)((long)in_stack_00000008 + local_38) = SUB81(in_RSI[local_38],0);
            }
            else {
              *in_stack_00000018 = -0xb;
              *(undefined1 *)((long)in_stack_00000008 + local_38) = 0xff;
            }
          }
          else {
            *(undefined1 *)((long)in_stack_00000008 + local_38) = *(undefined1 *)in_R9;
            *in_stack_00000010 = 1;
          }
        }
        return *in_stack_00000018;
      }
      if (in_EDI == 0x2a) {
        fffr4i1((float *)in_RSI,in_RCX,1.0,0.0,0,'\0',(char *)0x0,(int *)0x0,
                (uchar *)in_stack_00000008,in_stack_00000018);
      }
      else if (in_EDI == 0x52) {
        fffr8i1(in_RSI,in_RCX,1.0,0.0,0,'\0',(char *)0x0,(int *)0x0,(uchar *)in_stack_00000008,
                in_stack_00000018);
      }
      else {
        *in_stack_00000018 = 0x19a;
      }
    }
    for (local_38 = 0; local_38 < in_RCX; local_38 = local_38 + 1) {
      if (*(char *)(in_RDX + local_38) != '\0') {
        *(undefined1 *)((long)in_stack_00000008 + local_38) = *(undefined1 *)in_R9;
        *in_stack_00000010 = 1;
      }
    }
    break;
  default:
    *in_stack_00000018 = 0x19a;
    break;
  case 0xe:
    if ((in_EDI == 0xb) || (in_EDI == 0xe)) {
      for (local_38 = 0; local_38 < in_RCX; local_38 = local_38 + 1) {
        if (*(char *)((long)in_RSI + local_38) == '\0') {
          *(undefined1 *)((long)in_stack_00000008 + local_38) = 0;
        }
        else {
          *(undefined1 *)((long)in_stack_00000008 + local_38) = 1;
        }
      }
    }
    else if (in_EDI == 0x15) {
      for (local_38 = 0; local_38 < in_RCX; local_38 = local_38 + 1) {
        if (*(short *)((long)in_RSI + local_38 * 2) == 0) {
          *(undefined1 *)((long)in_stack_00000008 + local_38) = 0;
        }
        else {
          *(undefined1 *)((long)in_stack_00000008 + local_38) = 1;
        }
      }
    }
    else if (in_EDI == 0x29) {
      for (local_38 = 0; local_38 < in_RCX; local_38 = local_38 + 1) {
        if (in_RSI[local_38] == 0.0) {
          *(undefined1 *)((long)in_stack_00000008 + local_38) = 0;
        }
        else {
          *(undefined1 *)((long)in_stack_00000008 + local_38) = 1;
        }
      }
    }
    else if (in_EDI == 0x2a) {
      for (local_38 = 0; local_38 < in_RCX; local_38 = local_38 + 1) {
        fVar1 = *(float *)((long)in_RSI + local_38 * 4);
        if ((fVar1 != 0.0) || (NAN(fVar1))) {
          *(undefined1 *)((long)in_stack_00000008 + local_38) = 1;
        }
        else {
          *(undefined1 *)((long)in_stack_00000008 + local_38) = 0;
        }
      }
    }
    else if (in_EDI == 0x52) {
      for (local_38 = 0; local_38 < in_RCX; local_38 = local_38 + 1) {
        if ((in_RSI[local_38] != 0.0) || (NAN(in_RSI[local_38]))) {
          *(undefined1 *)((long)in_stack_00000008 + local_38) = 1;
        }
        else {
          *(undefined1 *)((long)in_stack_00000008 + local_38) = 0;
        }
      }
    }
    else {
      *in_stack_00000018 = 0x19a;
    }
    for (local_38 = 0; local_38 < in_RCX; local_38 = local_38 + 1) {
      if (*(char *)(in_RDX + local_38) != '\0') {
        *(undefined1 *)((long)in_stack_00000008 + local_38) = *(undefined1 *)in_R9;
        *in_stack_00000010 = 1;
      }
    }
    break;
  case 0x15:
    if ((in_EDI == 0xb) || (in_EDI == 0xe)) {
      for (local_38 = 0; local_38 < in_RCX; local_38 = local_38 + 1) {
        *(ushort *)((long)in_stack_00000008 + local_38 * 2) =
             (ushort)*(byte *)((long)in_RSI + local_38);
      }
    }
    else if (in_EDI == 0x15) {
      for (local_38 = 0; local_38 < in_RCX; local_38 = local_38 + 1) {
        *(undefined2 *)((long)in_stack_00000008 + local_38 * 2) =
             *(undefined2 *)((long)in_RSI + local_38 * 2);
      }
    }
    else {
      if (in_EDI == 0x29) {
        for (local_38 = 0; local_38 < in_RCX; local_38 = local_38 + 1) {
          if (*(char *)(in_RDX + local_38) == '\0') {
            if ((long)in_RSI[local_38] < -0x8000) {
              *in_stack_00000018 = -0xb;
              *(undefined2 *)((long)in_stack_00000008 + local_38 * 2) = 0x8000;
            }
            else if ((long)in_RSI[local_38] < 0x8000) {
              *(short *)((long)in_stack_00000008 + local_38 * 2) = SUB82(in_RSI[local_38],0);
            }
            else {
              *in_stack_00000018 = -0xb;
              *(undefined2 *)((long)in_stack_00000008 + local_38 * 2) = 0x7fff;
            }
          }
          else {
            *(undefined2 *)((long)in_stack_00000008 + local_38 * 2) = *(undefined2 *)in_R9;
            *in_stack_00000010 = 1;
          }
        }
        return *in_stack_00000018;
      }
      if (in_EDI == 0x2a) {
        fffr4i2((float *)in_RSI,in_RCX,1.0,0.0,0,0,(char *)0x0,(int *)0x0,(short *)in_stack_00000008
                ,in_stack_00000018);
      }
      else if (in_EDI == 0x52) {
        fffr8i2(in_RSI,in_RCX,1.0,0.0,0,0,(char *)0x0,(int *)0x0,(short *)in_stack_00000008,
                in_stack_00000018);
      }
      else {
        *in_stack_00000018 = 0x19a;
      }
    }
    for (local_38 = 0; local_38 < in_RCX; local_38 = local_38 + 1) {
      if (*(char *)(in_RDX + local_38) != '\0') {
        *(undefined2 *)((long)in_stack_00000008 + local_38 * 2) = *(undefined2 *)in_R9;
        *in_stack_00000010 = 1;
      }
    }
    break;
  case 0x1f:
    if ((in_EDI == 0xb) || (in_EDI == 0xe)) {
      for (local_38 = 0; local_38 < in_RCX; local_38 = local_38 + 1) {
        in_stack_00000008[local_38] = (float)(uint)*(byte *)((long)in_RSI + local_38);
      }
    }
    else if (in_EDI == 0x15) {
      for (local_38 = 0; local_38 < in_RCX; local_38 = local_38 + 1) {
        in_stack_00000008[local_38] = (float)(int)*(short *)((long)in_RSI + local_38 * 2);
      }
    }
    else if (in_EDI == 0x29) {
      for (local_38 = 0; local_38 < in_RCX; local_38 = local_38 + 1) {
        in_stack_00000008[local_38] = SUB84(in_RSI[local_38],0);
      }
    }
    else if (in_EDI == 0x2a) {
      fffr4int((float *)in_RSI,in_RCX,1.0,0.0,0,0,(char *)0x0,(int *)0x0,(int *)in_stack_00000008,
               in_stack_00000018);
    }
    else if (in_EDI == 0x52) {
      fffr8int(in_RSI,in_RCX,1.0,0.0,0,0,(char *)0x0,(int *)0x0,(int *)in_stack_00000008,
               in_stack_00000018);
    }
    else {
      *in_stack_00000018 = 0x19a;
    }
    for (local_38 = 0; local_38 < in_RCX; local_38 = local_38 + 1) {
      if (*(char *)(in_RDX + local_38) != '\0') {
        in_stack_00000008[local_38] = *in_R9;
        *in_stack_00000010 = 1;
      }
    }
    break;
  case 0x29:
    if ((in_EDI == 0xb) || (in_EDI == 0xe)) {
      for (local_38 = 0; local_38 < in_RCX; local_38 = local_38 + 1) {
        *(ulong *)(in_stack_00000008 + local_38 * 2) = (ulong)*(byte *)((long)in_RSI + local_38);
      }
    }
    else if (in_EDI == 0x15) {
      for (local_38 = 0; local_38 < in_RCX; local_38 = local_38 + 1) {
        *(long *)(in_stack_00000008 + local_38 * 2) = (long)*(short *)((long)in_RSI + local_38 * 2);
      }
    }
    else if (in_EDI == 0x29) {
      for (local_38 = 0; local_38 < in_RCX; local_38 = local_38 + 1) {
        *(double *)(in_stack_00000008 + local_38 * 2) = in_RSI[local_38];
      }
    }
    else if (in_EDI == 0x2a) {
      fffr4i4((float *)in_RSI,in_RCX,1.0,0.0,0,0,(char *)0x0,(int *)0x0,(long *)in_stack_00000008,
              in_stack_00000018);
    }
    else if (in_EDI == 0x52) {
      fffr8i4(in_RSI,in_RCX,1.0,0.0,0,0,(char *)0x0,(int *)0x0,(long *)in_stack_00000008,
              in_stack_00000018);
    }
    else {
      *in_stack_00000018 = 0x19a;
    }
    for (local_38 = 0; local_38 < in_RCX; local_38 = local_38 + 1) {
      if (*(char *)(in_RDX + local_38) != '\0') {
        *(undefined8 *)(in_stack_00000008 + local_38 * 2) = *(undefined8 *)in_R9;
        *in_stack_00000010 = 1;
      }
    }
    break;
  case 0x2a:
    if ((in_EDI == 0xb) || (in_EDI == 0xe)) {
      for (local_38 = 0; local_38 < in_RCX; local_38 = local_38 + 1) {
        in_stack_00000008[local_38] = (float)*(byte *)((long)in_RSI + local_38);
      }
    }
    else if (in_EDI == 0x15) {
      for (local_38 = 0; local_38 < in_RCX; local_38 = local_38 + 1) {
        in_stack_00000008[local_38] = (float)(int)*(short *)((long)in_RSI + local_38 * 2);
      }
    }
    else if (in_EDI == 0x29) {
      for (local_38 = 0; local_38 < in_RCX; local_38 = local_38 + 1) {
        in_stack_00000008[local_38] = (float)(long)in_RSI[local_38];
      }
    }
    else if (in_EDI == 0x2a) {
      for (local_38 = 0; local_38 < in_RCX; local_38 = local_38 + 1) {
        in_stack_00000008[local_38] = *(float *)((long)in_RSI + local_38 * 4);
      }
    }
    else if (in_EDI == 0x52) {
      fffr8r4(in_RSI,in_RCX,1.0,0.0,0,0.0,(char *)0x0,(int *)0x0,in_stack_00000008,in_stack_00000018
             );
    }
    else {
      *in_stack_00000018 = 0x19a;
    }
    for (local_38 = 0; local_38 < in_RCX; local_38 = local_38 + 1) {
      if (*(char *)(in_RDX + local_38) != '\0') {
        in_stack_00000008[local_38] = *in_R9;
        *in_stack_00000010 = 1;
      }
    }
    break;
  case 0x51:
    if ((in_EDI == 0xb) || (in_EDI == 0xe)) {
      for (local_38 = 0; local_38 < in_RCX; local_38 = local_38 + 1) {
        *(ulong *)(in_stack_00000008 + local_38 * 2) = (ulong)*(byte *)((long)in_RSI + local_38);
      }
    }
    else if (in_EDI == 0x15) {
      for (local_38 = 0; local_38 < in_RCX; local_38 = local_38 + 1) {
        *(long *)(in_stack_00000008 + local_38 * 2) = (long)*(short *)((long)in_RSI + local_38 * 2);
      }
    }
    else if (in_EDI == 0x29) {
      for (local_38 = 0; local_38 < in_RCX; local_38 = local_38 + 1) {
        *(double *)(in_stack_00000008 + local_38 * 2) = in_RSI[local_38];
      }
    }
    else if (in_EDI == 0x2a) {
      fffr4i8((float *)in_RSI,in_RCX,1.0,0.0,0,0,(char *)0x0,(int *)0x0,
              (LONGLONG *)in_stack_00000008,in_stack_00000018);
    }
    else if (in_EDI == 0x52) {
      fffr8i8(in_RSI,in_RCX,1.0,0.0,0,0,(char *)0x0,(int *)0x0,(LONGLONG *)in_stack_00000008,
              in_stack_00000018);
    }
    else {
      *in_stack_00000018 = 0x19a;
    }
    for (local_38 = 0; local_38 < in_RCX; local_38 = local_38 + 1) {
      if (*(char *)(in_RDX + local_38) != '\0') {
        *(undefined8 *)(in_stack_00000008 + local_38 * 2) = *(undefined8 *)in_R9;
        *in_stack_00000010 = 1;
      }
    }
    break;
  case 0x52:
    if ((in_EDI == 0xb) || (in_EDI == 0xe)) {
      for (local_38 = 0; local_38 < in_RCX; local_38 = local_38 + 1) {
        *(double *)(in_stack_00000008 + local_38 * 2) = (double)*(byte *)((long)in_RSI + local_38);
      }
    }
    else if (in_EDI == 0x15) {
      for (local_38 = 0; local_38 < in_RCX; local_38 = local_38 + 1) {
        *(double *)(in_stack_00000008 + local_38 * 2) =
             (double)(int)*(short *)((long)in_RSI + local_38 * 2);
      }
    }
    else if (in_EDI == 0x29) {
      for (local_38 = 0; local_38 < in_RCX; local_38 = local_38 + 1) {
        *(double *)(in_stack_00000008 + local_38 * 2) = (double)(long)in_RSI[local_38];
      }
    }
    else if (in_EDI == 0x2a) {
      for (local_38 = 0; local_38 < in_RCX; local_38 = local_38 + 1) {
        *(double *)(in_stack_00000008 + local_38 * 2) =
             (double)*(float *)((long)in_RSI + local_38 * 4);
      }
    }
    else if (in_EDI == 0x52) {
      for (local_38 = 0; local_38 < in_RCX; local_38 = local_38 + 1) {
        *(double *)(in_stack_00000008 + local_38 * 2) = in_RSI[local_38];
      }
    }
    else {
      *in_stack_00000018 = 0x19a;
    }
    for (local_38 = 0; local_38 < in_RCX; local_38 = local_38 + 1) {
      if (*(char *)(in_RDX + local_38) != '\0') {
        *(undefined8 *)(in_stack_00000008 + local_38 * 2) = *(undefined8 *)in_R9;
        *in_stack_00000010 = 1;
      }
    }
  }
  return *in_stack_00000018;
}

Assistant:

int ffcvtn( int   inputType,  /* I - Data type of input array               */
            void  *input,     /* I - Input array of type inputType          */
            char  *undef,     /* I - Array of flags indicating UNDEF elems  */
            long  ntodo,      /* I - Number of elements to process          */
            int   outputType, /* I - Data type of output array              */
            void  *nulval,    /* I - Ptr to value to use for UNDEF elements */
            void  *output,    /* O - Output array of type outputType        */
            int   *anynull,   /* O - Any nulls flagged?                     */
            int   *status )   /* O - Error status                           */
/*                                                                          */
/* Convert an array of any input data type to an array of any output        */
/* data type, using an array of UNDEF flags to assign nulvals to            */
/*--------------------------------------------------------------------------*/
{
   long i;

   switch( outputType ) {

   case TLOGICAL:
      switch( inputType ) {
      case TLOGICAL:
      case TBYTE:
         for( i=0; i<ntodo; i++ )
            if( ((unsigned char*)input)[i] )
                ((unsigned char*)output)[i] = 1;
            else
                ((unsigned char*)output)[i] = 0;
         break;
      case TSHORT:
         for( i=0; i<ntodo; i++ )
            if( ((short*)input)[i] )
                ((unsigned char*)output)[i] = 1;
            else
                ((unsigned char*)output)[i] = 0;
         break;
      case TLONG:
         for( i=0; i<ntodo; i++ )
            if( ((long*)input)[i] )
                ((unsigned char*)output)[i] = 1;
            else
                ((unsigned char*)output)[i] = 0;
         break;
      case TFLOAT:
         for( i=0; i<ntodo; i++ )
            if( ((float*)input)[i] )
                ((unsigned char*)output)[i] = 1;
            else
                ((unsigned char*)output)[i] = 0;
         break;
      case TDOUBLE:
         for( i=0; i<ntodo; i++ )
            if( ((double*)input)[i] )
                ((unsigned char*)output)[i] = 1;
            else
                ((unsigned char*)output)[i] = 0;
         break;
      default:
         *status = BAD_DATATYPE;
         break;
      }
      for(i=0;i<ntodo;i++) {
         if( undef[i] ) {
            ((unsigned char*)output)[i] = *(unsigned char*)nulval;
            *anynull = 1;
         }
      }
      break;

   case TBYTE:
      switch( inputType ) {
      case TLOGICAL:
      case TBYTE:
         for( i=0; i<ntodo; i++ )
            ((unsigned char*)output)[i] = ((unsigned char*)input)[i];
         break;
      case TSHORT:
         fffi2i1((short*)input,ntodo,1.,0.,0,0,0,NULL,NULL,(unsigned char*)output,status);
         break;
      case TLONG:
         for (i = 0; i < ntodo; i++) {
            if( undef[i] ) {
               ((unsigned char*)output)[i] = *(unsigned char*)nulval;
               *anynull = 1;
            } else {
               if( ((long*)input)[i] < 0 ) {
                  *status = OVERFLOW_ERR;
                  ((unsigned char*)output)[i] = 0;
               } else if( ((long*)input)[i] > UCHAR_MAX ) {
                  *status = OVERFLOW_ERR;
                  ((unsigned char*)output)[i] = UCHAR_MAX;
               } else
                  ((unsigned char*)output)[i] = 
                     (unsigned char) ((long*)input)[i];
            }
         }
         return( *status );
      case TFLOAT:
         fffr4i1((float*)input,ntodo,1.,0.,0,0,NULL,NULL,
                 (unsigned char*)output,status);
         break;
      case TDOUBLE:
         fffr8i1((double*)input,ntodo,1.,0.,0,0,NULL,NULL,
                 (unsigned char*)output,status);
         break;
      default:
         *status = BAD_DATATYPE;
         break;
      }
      for(i=0;i<ntodo;i++) {
         if( undef[i] ) {
            ((unsigned char*)output)[i] = *(unsigned char*)nulval;
            *anynull = 1;
         }
      }
      break;

   case TSHORT:
      switch( inputType ) {
      case TLOGICAL:
      case TBYTE:
         for( i=0; i<ntodo; i++ )
            ((short*)output)[i] = ((unsigned char*)input)[i];
         break;
      case TSHORT:
         for( i=0; i<ntodo; i++ )
            ((short*)output)[i] = ((short*)input)[i];
         break;
      case TLONG:
         for (i = 0; i < ntodo; i++) {
            if( undef[i] ) {
               ((short*)output)[i] = *(short*)nulval;
               *anynull = 1;
            } else {
               if( ((long*)input)[i] < SHRT_MIN ) {
                  *status = OVERFLOW_ERR;
                  ((short*)output)[i] = SHRT_MIN;
               } else if ( ((long*)input)[i] > SHRT_MAX ) {
                  *status = OVERFLOW_ERR;
                  ((short*)output)[i] = SHRT_MAX;
               } else
                  ((short*)output)[i] = (short) ((long*)input)[i];
            }
         }
         return( *status );
      case TFLOAT:
         fffr4i2((float*)input,ntodo,1.,0.,0,0,NULL,NULL,
                 (short*)output,status);
         break;
      case TDOUBLE:
         fffr8i2((double*)input,ntodo,1.,0.,0,0,NULL,NULL,
                 (short*)output,status);
         break;
      default:
         *status = BAD_DATATYPE;
         break;
      }
      for(i=0;i<ntodo;i++) {
         if( undef[i] ) {
            ((short*)output)[i] = *(short*)nulval;
            *anynull = 1;
         }
      }
      break;

   case TINT:
      switch( inputType ) {
      case TLOGICAL:
      case TBYTE:
         for( i=0; i<ntodo; i++ )
            ((int*)output)[i] = ((unsigned char*)input)[i];
         break;
      case TSHORT:
         for( i=0; i<ntodo; i++ )
            ((int*)output)[i] = ((short*)input)[i];
         break;
      case TLONG:
         for( i=0; i<ntodo; i++ )
            ((int*)output)[i] = ((long*)input)[i];
         break;
      case TFLOAT:
         fffr4int((float*)input,ntodo,1.,0.,0,0,NULL,NULL,
                  (int*)output,status);
         break;
      case TDOUBLE:
         fffr8int((double*)input,ntodo,1.,0.,0,0,NULL,NULL,
                  (int*)output,status);
         break;
      default:
         *status = BAD_DATATYPE;
         break;
      }
      for(i=0;i<ntodo;i++) {
         if( undef[i] ) {
            ((int*)output)[i] = *(int*)nulval;
            *anynull = 1;
         }
      }
      break;

   case TLONG:
      switch( inputType ) {
      case TLOGICAL:
      case TBYTE:
         for( i=0; i<ntodo; i++ )
            ((long*)output)[i] = ((unsigned char*)input)[i];
         break;
      case TSHORT:
         for( i=0; i<ntodo; i++ )
            ((long*)output)[i] = ((short*)input)[i];
         break;
      case TLONG:
         for( i=0; i<ntodo; i++ )
            ((long*)output)[i] = ((long*)input)[i];
         break;
      case TFLOAT:
         fffr4i4((float*)input,ntodo,1.,0.,0,0,NULL,NULL,
                 (long*)output,status);
         break;
      case TDOUBLE:
         fffr8i4((double*)input,ntodo,1.,0.,0,0,NULL,NULL,
                 (long*)output,status);
         break;
      default:
         *status = BAD_DATATYPE;
         break;
      }
      for(i=0;i<ntodo;i++) {
         if( undef[i] ) {
            ((long*)output)[i] = *(long*)nulval;
            *anynull = 1;
         }
      }
      break;

   case TLONGLONG:
      switch( inputType ) {
      case TLOGICAL:
      case TBYTE:
         for( i=0; i<ntodo; i++ )
            ((LONGLONG*)output)[i] = ((unsigned char*)input)[i];
         break;
      case TSHORT:
         for( i=0; i<ntodo; i++ )
            ((LONGLONG*)output)[i] = ((short*)input)[i];
         break;
      case TLONG:
         for( i=0; i<ntodo; i++ )
            ((LONGLONG*)output)[i] = ((long*)input)[i];
         break;
      case TFLOAT:
         fffr4i8((float*)input,ntodo,1.,0.,0,0,NULL,NULL,
                 (LONGLONG*)output,status);
         break;
      case TDOUBLE:
         fffr8i8((double*)input,ntodo,1.,0.,0,0,NULL,NULL,
                 (LONGLONG*)output,status);

         break;
      default:
         *status = BAD_DATATYPE;
         break;
      }
      for(i=0;i<ntodo;i++) {
         if( undef[i] ) {
            ((LONGLONG*)output)[i] = *(LONGLONG*)nulval;
            *anynull = 1;
         }
      }
      break;

   case TFLOAT:
      switch( inputType ) {
      case TLOGICAL:
      case TBYTE:
         for( i=0; i<ntodo; i++ )
            ((float*)output)[i] = ((unsigned char*)input)[i];
         break;
      case TSHORT:
         for( i=0; i<ntodo; i++ )
            ((float*)output)[i] = ((short*)input)[i];
         break;
      case TLONG:
         for( i=0; i<ntodo; i++ )
            ((float*)output)[i] = (float) ((long*)input)[i];
         break;
      case TFLOAT:
         for( i=0; i<ntodo; i++ )
            ((float*)output)[i] = ((float*)input)[i];
         break;
      case TDOUBLE:
         fffr8r4((double*)input,ntodo,1.,0.,0,0,NULL,NULL,
                 (float*)output,status);
         break;
      default:
         *status = BAD_DATATYPE;
         break;
      }
      for(i=0;i<ntodo;i++) {
         if( undef[i] ) {
            ((float*)output)[i] = *(float*)nulval;
            *anynull = 1;
         }
      }
      break;

   case TDOUBLE:
      switch( inputType ) {
      case TLOGICAL:
      case TBYTE:
         for( i=0; i<ntodo; i++ )
            ((double*)output)[i] = ((unsigned char*)input)[i];
         break;
      case TSHORT:
         for( i=0; i<ntodo; i++ )
            ((double*)output)[i] = ((short*)input)[i];
         break;
      case TLONG:
         for( i=0; i<ntodo; i++ )
            ((double*)output)[i] = ((long*)input)[i];
         break;
      case TFLOAT:
         for( i=0; i<ntodo; i++ )
            ((double*)output)[i] = ((float*)input)[i];
         break;
      case TDOUBLE:
         for( i=0; i<ntodo; i++ )
            ((double*)output)[i] = ((double*)input)[i];
         break;
      default:
         *status = BAD_DATATYPE;
         break;
      }
      for(i=0;i<ntodo;i++) {
         if( undef[i] ) {
            ((double*)output)[i] = *(double*)nulval;
            *anynull = 1;
         }
      }
      break;

   default:
      *status = BAD_DATATYPE;
      break;
   }

   return ( *status );
}